

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CartesianProduct.cpp
# Opt level: O0

CartesianProduct * __thiscall
mnf::CartesianProduct::description(CartesianProduct *this,string *prefix,bool firstCall)

{
  ulong uVar1;
  uint uVar2;
  ostream *poVar3;
  size_type sVar4;
  __shared_ptr_access<const_mnf::Manifold,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var5;
  element_type *peVar6;
  byte in_CL;
  undefined7 in_register_00000011;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268 [32];
  string local_248 [32];
  string local_228 [32];
  ulong local_208;
  size_t i;
  string local_1e0 [48];
  stringstream local_1b0 [8];
  stringstream ss;
  ostream local_1a0 [383];
  byte local_21;
  string *psStack_20;
  bool firstCall_local;
  string *prefix_local;
  CartesianProduct *this_local;
  
  psStack_20 = (string *)CONCAT71(in_register_00000011,firstCall);
  local_21 = in_CL & 1;
  prefix_local = prefix;
  this_local = this;
  std::__cxx11::stringstream::stringstream(local_1b0);
  if ((local_21 & 1) == 0) {
    for (local_208 = 0; uVar1 = local_208,
        sVar4 = std::
                vector<std::shared_ptr<const_mnf::Manifold>,_std::allocator<std::shared_ptr<const_mnf::Manifold>_>_>
                ::size((vector<std::shared_ptr<const_mnf::Manifold>,_std::allocator<std::shared_ptr<const_mnf::Manifold>_>_>
                        *)(prefix + 0x58)), uVar1 < sVar4; local_208 = local_208 + 1) {
      p_Var5 = (__shared_ptr_access<const_mnf::Manifold,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )std::
                vector<std::shared_ptr<const_mnf::Manifold>,_std::allocator<std::shared_ptr<const_mnf::Manifold>_>_>
                ::operator[]((vector<std::shared_ptr<const_mnf::Manifold>,_std::allocator<std::shared_ptr<const_mnf::Manifold>_>_>
                              *)(prefix + 0x58),local_208);
      peVar6 = std::
               __shared_ptr_access<const_mnf::Manifold,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(p_Var5);
      uVar2 = (*peVar6->_vptr_Manifold[4])();
      if ((uVar2 & 1) == 0) {
        poVar3 = std::operator<<(local_1a0,psStack_20);
        poVar3 = std::operator<<(poVar3,"/cartprod--------------------------");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        p_Var5 = (__shared_ptr_access<const_mnf::Manifold,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)std::
                    vector<std::shared_ptr<const_mnf::Manifold>,_std::allocator<std::shared_ptr<const_mnf::Manifold>_>_>
                    ::operator[]((vector<std::shared_ptr<const_mnf::Manifold>,_std::allocator<std::shared_ptr<const_mnf::Manifold>_>_>
                                  *)(prefix + 0x58),local_208);
        peVar6 = std::
                 __shared_ptr_access<const_mnf::Manifold,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->(p_Var5);
        std::operator+(local_268,(char *)psStack_20);
        (*peVar6->_vptr_Manifold[5])(local_248,peVar6,local_268,0);
        std::operator<<(local_1a0,local_248);
        std::__cxx11::string::~string(local_248);
        std::__cxx11::string::~string((string *)local_268);
        poVar3 = std::operator<<(local_1a0,psStack_20);
        poVar3 = std::operator<<(poVar3,"\\----------------------------------");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
      else {
        p_Var5 = (__shared_ptr_access<const_mnf::Manifold,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)std::
                    vector<std::shared_ptr<const_mnf::Manifold>,_std::allocator<std::shared_ptr<const_mnf::Manifold>_>_>
                    ::operator[]((vector<std::shared_ptr<const_mnf::Manifold>,_std::allocator<std::shared_ptr<const_mnf::Manifold>_>_>
                                  *)(prefix + 0x58),local_208);
        peVar6 = std::
                 __shared_ptr_access<const_mnf::Manifold,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->(p_Var5);
        (*peVar6->_vptr_Manifold[5])(local_228,peVar6,psStack_20,1);
        std::operator<<(local_1a0,local_228);
        std::__cxx11::string::~string(local_228);
      }
    }
  }
  else {
    poVar3 = std::operator<<(local_1a0,psStack_20);
    poVar3 = std::operator<<(poVar3,"/cartprod--------------------------");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i,
                   (char *)psStack_20);
    (**(code **)(*(long *)prefix + 0x28))(local_1e0,prefix,&i,0);
    std::operator<<(local_1a0,local_1e0);
    std::__cxx11::string::~string(local_1e0);
    std::__cxx11::string::~string((string *)&i);
    poVar3 = std::operator<<(local_1a0,psStack_20);
    poVar3 = std::operator<<(poVar3,"\\----------------------------------");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return this;
}

Assistant:

std::string CartesianProduct::description(const std::string& prefix,
                                          bool firstCall) const
{
  std::stringstream ss;
  if (firstCall)
  {
    ss << prefix << "/cartprod--------------------------" << std::endl;
    ss << this->description(prefix + "| ", false);
    ss << prefix << "\\----------------------------------" << std::endl;
  }
  else
  {
    for (size_t i = 0; i < subManifolds_.size(); ++i)
    {
      if (subManifolds_[i]->isElementary())
      {
        ss << subManifolds_[i]->description(prefix);
      }
      else
      {
        ss << prefix << "/cartprod--------------------------" << std::endl;
        ss << subManifolds_[i]->description(prefix + "| ", false);
        ss << prefix << "\\----------------------------------" << std::endl;
      }
    }
  }
  return ss.str();
}